

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

void __thiscall
adios2sys::Encoding::CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  vector<char_*,_std::allocator<char_*>_> *pvVar1;
  reference ppcVar2;
  vector<char_*,_std::allocator<char_*>_> *in_RDI;
  size_t i;
  vector<char_*,_std::allocator<char_*>_> *pvVar3;
  vector<char_*,_std::allocator<char_*>_> *this_00;
  
  pvVar3 = (vector<char_*,_std::allocator<char_*>_> *)0x0;
  while( true ) {
    this_00 = pvVar3;
    pvVar1 = (vector<char_*,_std::allocator<char_*>_> *)
             std::vector<char_*,_std::allocator<char_*>_>::size(in_RDI);
    if (pvVar1 <= pvVar3) break;
    ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](in_RDI,(size_type)this_00);
    free(*ppcVar2);
    pvVar3 = (vector<char_*,_std::allocator<char_*>_> *)
             ((long)&(this_00->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                     super__Vector_impl_data._M_start + 1);
  }
  std::vector<char_*,_std::allocator<char_*>_>::~vector(this_00);
  return;
}

Assistant:

Encoding::CommandLineArguments::~CommandLineArguments()
{
  for (size_t i = 0; i < this->argv_.size(); i++) {
    free(argv_[i]);
  }
}